

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::RandomBernoulliLikeLayerParams::RandomBernoulliLikeLayerParams
          (RandomBernoulliLikeLayerParams *this,RandomBernoulliLikeLayerParams *from)

{
  RandomBernoulliLikeLayerParams *from_local;
  RandomBernoulliLikeLayerParams *this_local;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__RandomBernoulliLikeLayerParams_006f6d40;
  google::protobuf::internal::CachedSize::CachedSize(&this->_cached_size_);
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  memcpy(&this->seed_,&from->seed_,0xc);
  return;
}

Assistant:

RandomBernoulliLikeLayerParams::RandomBernoulliLikeLayerParams(const RandomBernoulliLikeLayerParams& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite() {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  ::memcpy(&seed_, &from.seed_,
    static_cast<size_t>(reinterpret_cast<char*>(&prob_) -
    reinterpret_cast<char*>(&seed_)) + sizeof(prob_));
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.RandomBernoulliLikeLayerParams)
}